

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_mul_v_parity_uint64_128_30(mzd_local_t *c,mzd_local_t *v,mzd_local_t *At)

{
  ulong *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long in_RDX;
  ulong *in_RSI;
  undefined8 *in_RDI;
  word parity2;
  word parity1;
  block_t *Ablock;
  uint i;
  word res;
  block_t *vblock;
  block_t *cblock;
  int local_34;
  ulong local_30;
  
  local_30 = 0;
  for (local_34 = 0xf; local_34 != 0; local_34 = local_34 + -1) {
    puVar1 = (ulong *)(in_RDX + (ulong)(0xf - local_34) * 0x20);
    uVar2 = parity64_uint64(*in_RSI & *puVar1 ^ in_RSI[1] & puVar1[1]);
    uVar3 = parity64_uint64(*in_RSI & puVar1[2] ^ in_RSI[1] & puVar1[3]);
    local_30 = (uVar2 | uVar3 << 1) << ((char)local_34 * -2 + 0x40U & 0x3f) | local_30;
  }
  *in_RDI = 0;
  in_RDI[1] = local_30;
  return;
}

Assistant:

void mzd_mul_v_parity_uint64_128_30(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* At) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);

  word res = 0;
  for (unsigned int i = 15; i; --i) {
    const block_t* Ablock = CONST_BLOCK(At, 15 - i);
    const word parity1 =
        parity64_uint64((vblock->w64[0] & Ablock->w64[0]) ^ (vblock->w64[1] & Ablock->w64[1]));
    const word parity2 =
        parity64_uint64((vblock->w64[0] & Ablock->w64[2]) ^ (vblock->w64[1] & Ablock->w64[3]));
    res |= (parity1 | (parity2 << 1)) << (64 - (2 * i));
  }
  cblock->w64[0] = 0;
  cblock->w64[1] = res;
}